

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Loop::IsLCSSA(Loop *this)

{
  IRContext *pIVar1;
  __node_base_ptr this_00;
  bool bVar2;
  CFG *this_01;
  BasicBlockListTy *this_02;
  reference pvVar3;
  Instruction *def;
  anon_class_24_3_490be7f5 local_e0;
  function<bool_(spvtools::opt::Instruction_*)> local_c8;
  Instruction *local_a8;
  Instruction *insn;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  _Node_iterator_base<unsigned_int,_false> _Stack_80;
  uint32_t bb_id;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  IRContext *ir_context;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  DefUseManager *def_use_mgr;
  CFG *cfg;
  Loop *this_local;
  
  this_01 = IRContext::cfg(this->context_);
  exit_blocks._M_h._M_single_bucket = (__node_base_ptr)IRContext::get_def_use_mgr(this->context_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ir_context);
  GetExitBlocks(this,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&ir_context);
  pIVar1 = this->context_;
  this_02 = GetBlocks(this);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_02);
  _Stack_80._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_02);
  do {
    bVar2 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff80);
    if (!bVar2) {
      this_local._7_1_ = true;
LAB_003ebb40:
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&ir_context);
      return this_local._7_1_;
    }
    pvVar3 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    CFG::block(this_01,*pvVar3);
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&insn);
    while( true ) {
      bVar2 = utils::operator!=(&__end3.super_iterator,
                                (iterator_template<spvtools::opt::Instruction> *)&insn);
      if (!bVar2) break;
      def = utils::IntrusiveList<spvtools::opt::Instruction>::
            iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      this_00 = exit_blocks._M_h._M_single_bucket;
      local_e0.exit_blocks =
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)&ir_context;
      local_e0.ir_context = pIVar1;
      local_e0.this = this;
      local_a8 = def;
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::Loop::IsLCSSA()const::__0,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_c8,&local_e0);
      bVar2 = analysis::DefUseManager::WhileEachUser((DefUseManager *)this_00,def,&local_c8);
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_c8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_003ebb40;
      }
      InstructionList::iterator::operator++(&__end3);
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  } while( true );
}

Assistant:

bool Loop::IsLCSSA() const {
  CFG* cfg = context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  std::unordered_set<uint32_t> exit_blocks;
  GetExitBlocks(&exit_blocks);

  // Declare ir_context so we can capture context_ in the below lambda
  IRContext* ir_context = context_;

  for (uint32_t bb_id : GetBlocks()) {
    for (Instruction& insn : *cfg->block(bb_id)) {
      // All uses must be either:
      //  - In the loop;
      //  - In an exit block and in a phi instruction.
      if (!def_use_mgr->WhileEachUser(
              &insn,
              [&exit_blocks, ir_context, this](Instruction* use) -> bool {
                BasicBlock* parent = ir_context->get_instr_block(use);
                assert(parent && "Invalid analysis");
                if (IsInsideLoop(parent)) return true;
                if (use->opcode() != spv::Op::OpPhi) return false;
                return exit_blocks.count(parent->id());
              }))
        return false;
    }
  }
  return true;
}